

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

Filter * helics::generateTranslator
                   (Federate *fed,bool global,string_view name,TranslatorTypes ttype,
                   string_view endpointType,string_view units)

{
  Filter *this;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,global) == 0) {
    this = Federate::registerTranslator(fed,0,name,endpointType,units);
  }
  else {
    this = (Filter *)
           ConnectorFederateManager::registerTranslator
                     ((fed->cManager)._M_t.
                      super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
                      .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl
                      ,name,endpointType,units);
    Translator::setTranslatorType((Translator *)this,0);
  }
  if (ttype != CUSTOM) {
    Translator::setTranslatorType((Translator *)this,ttype);
  }
  return this;
}

Assistant:

static Translator& generateTranslator(Federate* fed,
                                      bool global,
                                      std::string_view name,
                                      TranslatorTypes ttype,
                                      std::string_view endpointType,
                                      std::string_view units)
{
    Translator& trans = (global) ? fed->registerGlobalTranslator(name, endpointType, units) :
                                   fed->registerTranslator(name, endpointType, units);
    if (ttype != TranslatorTypes::CUSTOM) {
        trans.setTranslatorType(static_cast<std::int32_t>(ttype));
    }
    return trans;
}